

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall spdlog::details::registry::disable_backtrace(registry *this)

{
  __node_base *p_Var1;
  
  CLI::std::mutex::lock((mutex *)this);
  this->backtrace_n_messages_ = 0;
  p_Var1 = &(this->loggers_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    backtracer::disable((backtracer *)(p_Var1[5]._M_nxt + 0xd));
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::disable_backtrace() {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    backtrace_n_messages_ = 0;
    for (auto &l : loggers_) {
        l.second->disable_backtrace();
    }
}